

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O3

ArchitectureCapability * ArchitectureCapability::findCapability(Document *doc)

{
  ArchitectureCapability *pAVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (thelist.
      super__Vector_base<ArchitectureCapability_*,_std::allocator<ArchitectureCapability_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      thelist.
      super__Vector_base<ArchitectureCapability_*,_std::allocator<ArchitectureCapability_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      pAVar1 = thelist.
               super__Vector_base<ArchitectureCapability_*,_std::allocator<ArchitectureCapability_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4];
      iVar3 = (*(pAVar1->super_CapabilityPoint)._vptr_CapabilityPoint[5])(pAVar1,doc);
      if ((char)iVar3 != '\0') {
        return pAVar1;
      }
      bVar2 = uVar5 < (ulong)((long)thelist.
                                    super__Vector_base<ArchitectureCapability_*,_std::allocator<ArchitectureCapability_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)thelist.
                                    super__Vector_base<ArchitectureCapability_*,_std::allocator<ArchitectureCapability_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return (ArchitectureCapability *)0x0;
}

Assistant:

void Architecture::parsePreferSplit(const Element *el)

{
  string style = el->getAttributeValue("style");
  if (style != "inhalf")
    throw LowlevelError("Unknown prefersplit style: "+style);
  const List &list(el->getChildren());
  List::const_iterator iter;

  for(iter=list.begin();iter!=list.end();++iter) {
    splitrecords.push_back(PreferSplitRecord());
    PreferSplitRecord &record( splitrecords.back() );
    record.storage.restoreXml( *iter, this );
    record.splitoffset = record.storage.size/2;
  }
}